

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

PIPELINE_STATE_STATUS __thiscall
Diligent::PipelineStateGLImpl::GetStatus(PipelineStateGLImpl *this,bool WaitForCompletion)

{
  PipelineBuilderBase *pPVar1;
  int iVar2;
  
  pPVar1 = (this->m_Builder)._M_t.
           super___uniq_ptr_impl<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
           .super__Head_base<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_false>.
           _M_head_impl;
  if (pPVar1 != (PipelineBuilderBase *)0x0) {
    iVar2 = (*pPVar1->_vptr_PipelineBuilderBase[2])(pPVar1,(ulong)WaitForCompletion);
    if ((char)iVar2 != '\0') {
      pPVar1 = (this->m_Builder)._M_t.
               super___uniq_ptr_impl<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
               .super__Head_base<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_false>.
               _M_head_impl;
      (this->m_Builder)._M_t.
      super___uniq_ptr_impl<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
      .super__Head_base<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_false>.
      _M_head_impl = (PipelineBuilderBase *)0x0;
      if (pPVar1 != (PipelineBuilderBase *)0x0) {
        (*pPVar1->_vptr_PipelineBuilderBase[1])();
      }
    }
  }
  return (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Status._M_i;
}

Assistant:

PIPELINE_STATE_STATUS PipelineStateGLImpl::GetStatus(bool WaitForCompletion)
{
    if (m_Builder)
    {
        if (m_Builder->Tick(WaitForCompletion))
        {
            m_Builder.reset();
        }
    }
    return m_Status.load();
}